

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_type __n;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator local_91;
  char **local_90;
  size_type *local_88;
  size_type local_80;
  size_type local_78;
  undefined8 uStack_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((exr_version == (EXRVersion *)0x0 || exr_header == (EXRHeader *)0x0) ||
      filename == (char *)0x0) {
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Invalid argument for ParseEXRHeaderFromFile","");
    psVar8 = local_88;
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_88);
      *err = pcVar3;
    }
    if (psVar8 != &local_78) {
      operator_delete(psVar8);
    }
    iVar2 = -3;
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::string::string((string *)&local_50,filename,(allocator *)&local_68);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_50,0,0,"Cannot read file ",0x11);
      psVar8 = (size_type *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8 == paVar7) {
        local_78 = paVar7->_M_allocated_capacity;
        uStack_70 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        psVar8 = &local_78;
      }
      else {
        local_78 = paVar7->_M_allocated_capacity;
      }
      local_80 = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      local_88 = psVar8;
      if (err != (char **)0x0) {
        pcVar3 = strdup((char *)psVar8);
        *err = pcVar3;
      }
      if (psVar8 != &local_78) {
        operator_delete(psVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      iVar2 = -7;
    }
    else {
      local_90 = err;
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_68,__n,(allocator_type *)&local_88);
      sVar4 = fread(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (sVar4 == __n) {
        if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar6 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar6);
        }
        iVar2 = ParseEXRHeaderFromMemory
                          (exr_header,exr_version,
                           local_68.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,__n,local_90);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,filename,&local_91);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_50,0,0,"fread() error on ",0x11);
        ppcVar1 = local_90;
        psVar8 = (size_type *)(pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8 == paVar7) {
          local_78 = paVar7->_M_allocated_capacity;
          uStack_70 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          psVar8 = &local_78;
        }
        else {
          local_78 = paVar7->_M_allocated_capacity;
        }
        local_80 = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_88 = psVar8;
        if (local_90 != (char **)0x0) {
          pcVar3 = strdup((char *)psVar8);
          *ppcVar1 = pcVar3;
        }
        if (psVar8 != &local_78) {
          operator_delete(psVar8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        iVar2 = -5;
      }
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return iVar2;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for ParseEXRHeaderFromFile",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || defined(__MINGW32__)  // MSVC, MinGW gcc or clang
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_INVALID_FILE;
  }
#else
  // Unknown compiler
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      tinyexr::SetErrorMessage("fread() error on " + std::string(filename),
                               err);
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, &buf.at(0), filesize,
                                  err);
}